

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::tableLanguage(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  RefAST RVar1;
  uint uVar2;
  int iVar3;
  NoViableAltException *pNVar4;
  RefAST *this_02;
  RefAST tmp40_AST;
  RefAST tmp42_AST;
  RefAST tmp41_AST;
  RefCount<AST> local_b0;
  ASTPair currentAST;
  RefCount<Token> local_98;
  ASTFactory local_90;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefAST tmp39_AST;
  RefToken local_68;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_b0.ref = nullAST.ref;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 2;
  }
  tmp39_AST.ref = local_b0.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp40_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp39_AST,&tmp40_AST);
  RefCount<AST>::~RefCount(&tmp40_AST);
  RefCount<Token>::~RefCount(&local_78);
  Parser::match((Parser *)this,6);
  tmp40_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
  ASTFactory::create((ASTFactory *)&tmp41_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp40_AST,&tmp41_AST);
  RefCount<AST>::~RefCount(&tmp41_AST);
  RefCount<Token>::~RefCount(&local_80);
  if (tmp40_AST.ref != (Ref *)0x0) {
    (tmp40_AST.ref)->count = (tmp40_AST.ref)->count + 1;
  }
  local_50.ref = tmp40_AST.ref;
  ASTFactory::addASTChild(this_01,&currentAST,&local_50);
  RefCount<AST>::~RefCount(&local_50);
  Parser::match((Parser *)this,0x23);
  tmp41_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)&tmp42_AST,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp41_AST,&tmp42_AST);
  RefCount<AST>::~RefCount(&tmp42_AST);
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_90.nodeFactory);
  Parser::match((Parser *)this,7);
  uVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (0xf < uVar2) {
LAB_00165ffc:
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_60);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  if ((0xe300U >> (uVar2 & 0x1f) & 1) == 0) {
    if (uVar2 != 0xb) goto LAB_00165ffc;
    directives(this);
    local_58.ref = this_00->ref;
    if (local_58.ref != (Ref *)0x0) {
      (local_58.ref)->count = (local_58.ref)->count + 1;
    }
    ASTFactory::addASTChild(this_01,&currentAST,&local_58);
    RefCount<AST>::~RefCount(&local_58);
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar1 = nullAST;
  if (iVar3 - 0xdU < 3) goto LAB_00166169;
  if (iVar3 == 9) goto LAB_00166169;
  if (iVar3 != 8) {
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_68);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  tmp42_AST = RVar1;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
  ASTFactory::create(&local_90,(RefToken *)this_01);
  RefCount<AST>::operator=(&tmp42_AST,(RefCount<AST> *)&local_90);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_90);
  RefCount<Token>::~RefCount(&local_98);
  Parser::match((Parser *)this,8);
  this_02 = &tmp42_AST;
  while( true ) {
    while( true ) {
      while( true ) {
        RefCount<AST>::~RefCount(this_02);
LAB_00166169:
        iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
        if (iVar3 != 0xe) break;
        tableDecl(this);
        local_48.ref = this_00->ref;
        if (local_48.ref != (Ref *)0x0) {
          (local_48.ref)->count = (local_48.ref)->count + 1;
        }
        this_02 = &local_48;
        ASTFactory::addASTChild(this_01,&currentAST,this_02);
      }
      if (iVar3 != 0xd) break;
      languageSpecList(this);
      local_40.ref = this_00->ref;
      if (local_40.ref != (Ref *)0x0) {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      this_02 = &local_40;
      ASTFactory::addASTChild(this_01,&currentAST,this_02);
    }
    if (iVar3 != 9) break;
    languageEnv(this);
    local_38.ref = this_00->ref;
    if (local_38.ref != (Ref *)0x0) {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    this_02 = &local_38;
    ASTFactory::addASTChild(this_01,&currentAST,this_02);
  }
  RefCount<AST>::operator=(&local_b0,&currentAST.root);
  RefCount<AST>::~RefCount(&tmp41_AST);
  RefCount<AST>::~RefCount(&tmp40_AST);
  RefCount<AST>::~RefCount(&tmp39_AST);
  RefCount<AST>::operator=(this_00,&local_b0);
  RefCount<AST>::~RefCount(&local_b0);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::tableLanguage() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableLanguage_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp39_AST = nullAST;
		tmp39_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp40_AST = nullAST;
		tmp40_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp40_AST);
		match(LITERAL_language);
		RefAST tmp41_AST = nullAST;
		tmp41_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_SEMI:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp42_AST = nullAST;
			tmp42_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			switch ( LA(1)) {
			case LITERAL_environment:
			{
				languageEnv();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case IDENT:
			{
				languageSpecList();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_table:
			{
				tableDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop156;
			}
			}
		} while (true);
		_loop156:;
		}
		tableLanguage_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableLanguage_AST;
}